

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O2

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,v3i *Val)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int in_EAX;
  size_t sVar4;
  long lVar5;
  anon_union_8_2_2df48d06_for_stref_0 local_60;
  undefined4 local_58;
  anon_union_8_2_2df48d06_for_stref_0 local_50;
  undefined4 local_48;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  lVar1 = 4;
  do {
    lVar5 = lVar1;
    bVar3 = (byte)in_EAX;
    if (NArgs <= lVar5) goto LAB_00107838;
    in_EAX = strncmp(Args[lVar5 + -3],Opt,0x20);
    lVar1 = lVar5 + 1;
  } while (in_EAX != 0);
  local_40 = (anon_union_8_2_2df48d06_for_stref_0)
             ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar5 + -2))->Ptr;
  sVar4 = strlen(local_40.Ptr);
  local_38 = (undefined4)sVar4;
  bVar2 = ToInt((stref *)&local_40,(int *)Val);
  if (bVar2) {
    local_50 = (anon_union_8_2_2df48d06_for_stref_0)
               ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar5 + -1))->Ptr;
    sVar4 = strlen(local_50.Ptr);
    local_48 = (undefined4)sVar4;
    bVar2 = ToInt((stref *)&local_50,&(Val->field_0).field_0.Y);
    if (bVar2) {
      local_60 = (anon_union_8_2_2df48d06_for_stref_0)
                 ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar5))->Ptr;
      sVar4 = strlen(local_60.Ptr);
      local_58 = (undefined4)sVar4;
      bVar3 = ToInt((stref *)&local_60,&(Val->field_0).field_0.Z);
      goto LAB_00107838;
    }
  }
  bVar3 = 0;
LAB_00107838:
  return (bool)(lVar5 < NArgs & bVar3);
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, v3i* Val)
{
  for (int I = 1; I + 3 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      return ToInt(Args[I + 1], &Val->X) && ToInt(Args[I + 2], &Val->Y) &&
             ToInt(Args[I + 3], &Val->Z);
    }
  }

  return false;
}